

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

size_t __thiscall Memory::HeapInfo::GetSmallHeapBlockCount(HeapInfo *this,bool checkCount)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_00;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_01;
  RecyclerSweepManager *this_02;
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  undefined8 *in_FS_OFFSET;
  
  lVar15 = 0;
  for (lVar14 = 0x78; lVar14 != 0xa878; lVar14 = lVar14 + 0x380) {
    this_00 = (HeapBucketGroup<SmallAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar14);
    sVar4 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_00,checkCount);
    sVar5 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_00);
    lVar15 = sVar5 + sVar4 + lVar15;
  }
  for (lVar14 = 0xa878; lVar14 != 0x10df8; lVar14 = lVar14 + 0x380) {
    this_01 = (HeapBucketGroup<MediumAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar14);
    sVar4 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_01,checkCount);
    sVar5 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_01);
    lVar15 = sVar5 + sVar4 + lVar15;
  }
  sVar4 = HeapBlockList::Count<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newLeafHeapBlockList);
  sVar5 = HeapBlockList::Count<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newNormalHeapBlockList);
  sVar6 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newFinalizableHeapBlockList);
  sVar7 = HeapBlockList::
          Count<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newNormalWithBarrierHeapBlockList);
  sVar8 = HeapBlockList::
          Count<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->newFinalizableWithBarrierHeapBlockList);
  sVar9 = HeapBlockList::Count<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->newMediumLeafHeapBlockList);
  sVar10 = HeapBlockList::Count<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumNormalHeapBlockList);
  sVar11 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumFinalizableHeapBlockList);
  sVar12 = HeapBlockList::
           Count<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumNormalWithBarrierHeapBlockList);
  sVar13 = HeapBlockList::
           Count<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                     (this->newMediumFinalizableWithBarrierHeapBlockList);
  sVar4 = sVar13 + sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + lVar15
  ;
  if ((this->recycler != (Recycler *)0x0) &&
     (this_02 = this->recycler->recyclerSweepManager, this_02 != (RecyclerSweepManager *)0x0)) {
    bVar3 = RecyclerSweepManager::IsBackground(this_02);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x68c,"(!this->recycler->recyclerSweepManager->IsBackground())",
                         "!this->recycler->recyclerSweepManager->IsBackground()");
      if (!bVar3) goto LAB_00261fb9;
      *puVar1 = 0;
    }
    sVar5 = RecyclerSweepManager::GetPendingMergeNewHeapBlockCount
                      (this->recycler->recyclerSweepManager,this);
    sVar4 = sVar4 + sVar5;
  }
  if ((checkCount) &&
     (sVar4 != this->heapBlockCount[8] + this->heapBlockCount[4] +
               this->heapBlockCount[6] + this->heapBlockCount[2] +
               this->heapBlockCount[7] + this->heapBlockCount[3] +
               this->heapBlockCount[5] + this->heapBlockCount[1] + this->heapBlockCount[9] +
               this->heapBlockCount[10])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6a6,
                       "(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar3) {
LAB_00261fb9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return sVar4;
}

Assistant:

size_t
HeapInfo::GetSmallHeapBlockCount(bool checkCount) const
{
    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newRecyclerVisitedHostHeapBlockList);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableWithBarrierHeapBlockList);
#endif

    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableWithBarrierHeapBlockList);
#endif

    // TODO: Update recycler sweep
    // Recycler can be null if we have OOM in the ctor
    if (this->recycler && this->recycler->recyclerSweepManager != nullptr)
    {
        // This function can't be called in the background
        Assert(!this->recycler->recyclerSweepManager->IsBackground());
        currentSmallHeapBlockCount += this->recycler->recyclerSweepManager->GetPendingMergeNewHeapBlockCount(this);
    }
#endif
#ifdef RECYCLER_SLOW_CHECK_ENABLED
    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];


#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif
    Assert(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount);
#endif

    return currentSmallHeapBlockCount;
}